

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O1

int aes_cfb_decrypt(uchar *ibuf,uchar *obuf,int len,uchar *iv,aes_encrypt_ctx *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = (ctx->inf).b[2];
  uVar4 = (ulong)bVar1;
  if (bVar1 == 0) {
    uVar10 = 0;
    uVar9 = 0;
  }
  else {
    uVar10 = 0;
    if (len < 1 || 0xf < bVar1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar5 = (ulong)bVar1;
      do {
        bVar1 = ibuf[uVar9];
        obuf[uVar9] = iv[uVar5] ^ bVar1;
        iv[uVar5] = bVar1;
        uVar4 = uVar5 + 1;
        uVar9 = uVar9 + 1;
        if (0xe < uVar5) break;
        uVar5 = uVar4;
      } while ((int)uVar9 < len);
      ibuf = ibuf + uVar9;
      obuf = obuf + uVar9;
    }
    if ((int)uVar4 != 0x10) {
      uVar10 = uVar4 & 0xffffffff;
    }
  }
  if (0xf < (uint)(len - (int)uVar9)) {
    if ((((uint)obuf | (uint)ibuf | (uint)iv) & 3) == 0) {
      while (uVar7 = (int)uVar9 + 0x10, (int)uVar7 <= len) {
        if ((int)uVar10 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x294,
                        "int aes_cfb_decrypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar3 = aes_encrypt(iv,iv,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        uVar8 = *(uint *)ibuf;
        *(uint *)obuf = *(uint *)iv ^ uVar8;
        *(uint *)iv = uVar8;
        uVar8 = *(uint *)((long)ibuf + 4);
        *(uint *)((long)obuf + 4) = *(uint *)(iv + 4) ^ uVar8;
        *(uint *)(iv + 4) = uVar8;
        uVar8 = *(uint *)((long)ibuf + 8);
        *(uint *)((long)obuf + 8) = *(uint *)(iv + 8) ^ uVar8;
        *(uint *)(iv + 8) = uVar8;
        uVar8 = *(uint *)((long)ibuf + 0xc);
        *(uint *)((long)obuf + 0xc) = *(uint *)(iv + 0xc) ^ uVar8;
        *(uint *)(iv + 0xc) = uVar8;
        ibuf = (uchar *)((long)ibuf + 0x10);
        obuf = (uchar *)((long)obuf + 0x10);
        uVar9 = (ulong)uVar7;
      }
    }
    else {
      while (uVar7 = (int)uVar9 + 0x10, (int)uVar7 <= len) {
        if ((int)uVar10 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x2a4,
                        "int aes_cfb_decrypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar3 = aes_encrypt(iv,iv,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        uVar8 = *(uint *)ibuf;
        *obuf = *iv ^ (byte)uVar8;
        *iv = (byte)uVar8;
        bVar1 = *(byte *)((long)ibuf + 1);
        *(byte *)((long)obuf + 1) = iv[1] ^ bVar1;
        iv[1] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 2);
        *(byte *)((long)obuf + 2) = iv[2] ^ bVar1;
        iv[2] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 3);
        *(byte *)((long)obuf + 3) = iv[3] ^ bVar1;
        iv[3] = bVar1;
        uVar8 = *(uint *)((long)ibuf + 4);
        *(byte *)((long)obuf + 4) = iv[4] ^ (byte)uVar8;
        iv[4] = (byte)uVar8;
        bVar1 = *(byte *)((long)ibuf + 5);
        *(byte *)((long)obuf + 5) = iv[5] ^ bVar1;
        iv[5] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 6);
        *(byte *)((long)obuf + 6) = iv[6] ^ bVar1;
        iv[6] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 7);
        *(byte *)((long)obuf + 7) = iv[7] ^ bVar1;
        iv[7] = bVar1;
        uVar8 = *(uint *)((long)ibuf + 8);
        *(byte *)((long)obuf + 8) = iv[8] ^ (byte)uVar8;
        iv[8] = (byte)uVar8;
        bVar1 = *(byte *)((long)ibuf + 9);
        *(byte *)((long)obuf + 9) = iv[9] ^ bVar1;
        iv[9] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 10);
        *(byte *)((long)obuf + 10) = iv[10] ^ bVar1;
        iv[10] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 0xb);
        *(byte *)((long)obuf + 0xb) = iv[0xb] ^ bVar1;
        iv[0xb] = bVar1;
        uVar8 = *(uint *)((long)ibuf + 0xc);
        *(byte *)((long)obuf + 0xc) = iv[0xc] ^ (byte)uVar8;
        iv[0xc] = (byte)uVar8;
        bVar1 = *(byte *)((long)ibuf + 0xd);
        *(byte *)((long)obuf + 0xd) = iv[0xd] ^ bVar1;
        iv[0xd] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 0xe);
        *(byte *)((long)obuf + 0xe) = iv[0xe] ^ bVar1;
        iv[0xe] = bVar1;
        bVar1 = *(byte *)((long)ibuf + 0xf);
        *(byte *)((long)obuf + 0xf) = iv[0xf] ^ bVar1;
        iv[0xf] = bVar1;
        ibuf = (uchar *)((long)ibuf + 0x10);
        obuf = (uchar *)((long)obuf + 0x10);
        uVar9 = (ulong)uVar7;
      }
    }
  }
  do {
    if (len <= (int)uVar9) {
      (ctx->inf).b[2] = (uint8_t)uVar10;
      return 0;
    }
    uVar7 = (uint)uVar10;
    if (uVar7 == 0) {
      iVar3 = aes_encrypt(iv,iv,ctx);
      uVar4 = 0;
      if (iVar3 == 0) goto LAB_002772bd;
      bVar2 = false;
    }
    else {
LAB_002772bd:
      if (((int)uVar9 < len) && ((int)uVar7 < 0x10)) {
        pbVar6 = iv + uVar10;
        do {
          uVar7 = *(uint *)ibuf;
          ibuf = (uchar *)((long)ibuf + 1);
          *obuf = *pbVar6 ^ (byte)uVar7;
          obuf = (uchar *)((long)obuf + 1);
          *pbVar6 = (byte)uVar7;
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          iVar3 = (int)uVar10;
          uVar7 = iVar3 + 1;
          if (len <= (int)uVar8) break;
          pbVar6 = pbVar6 + 1;
          uVar10 = (ulong)uVar7;
        } while (iVar3 < 0xf);
      }
      uVar4 = (ulong)uVar7;
      if (uVar7 == 0x10) {
        uVar4 = 0;
      }
      bVar2 = true;
    }
    uVar10 = uVar4;
    if (!bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

AES_RETURN aes_cfb_decrypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, unsigned char *iv, aes_encrypt_ctx ctx[1])
{   int cnt = 0, b_pos = (int)ctx->inf.b[2], nb;

    if(b_pos)           /* complete any partial block   */
    {   uint8_t t;

        while(b_pos < AES_BLOCK_SIZE && cnt < len)
        {
            t = *ibuf++;
            *obuf++ = t ^ iv[b_pos];
            iv[b_pos++] = t;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    if((nb = (len - cnt) >> 4) != 0)    /* process whole blocks */
    {
#if defined( USE_VIA_ACE_IF_PRESENT )

        if(ctx->inf.b[1] == 0xff)
        {   int m;
            uint8_t *ksp = (uint8_t*)(ctx->ks), *ivp = iv;
            aligned_auto(uint8_t, liv, AES_BLOCK_SIZE, 16);
            via_cwd(cwd, hybrid, dec, 2 * ctx->inf.b[0] - 192);

            if(ALIGN_OFFSET( ctx, 16 ))
                return EXIT_FAILURE;

            if(ALIGN_OFFSET( iv, 16 ))   /* ensure an aligned iv */
            {
                ivp = liv;
                memcpy(liv, iv, AES_BLOCK_SIZE);
            }

            if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ))
            {
                via_cfb_op6(ksp, cwd, ibuf, obuf, nb, ivp);
                ibuf += nb * AES_BLOCK_SIZE;
                obuf += nb * AES_BLOCK_SIZE;
                cnt  += nb * AES_BLOCK_SIZE;
            }
            else    /* input, output or both are unaligned  */
            {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
                uint8_t *ip, *op;

                while(nb)
                {
                    m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb), nb -= m;

                    ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                    op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                    if(ip != ibuf)  /* input buffer is not aligned */
                        memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                    via_cfb_op6(ksp, cwd, ip, op, m, ivp);

                    if(op != obuf)  /* output buffer is not aligned */
                        memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                    ibuf += m * AES_BLOCK_SIZE;
                    obuf += m * AES_BLOCK_SIZE;
                    cnt  += m * AES_BLOCK_SIZE;
                }
            }

            if(ivp != iv)
                memcpy(iv, ivp, AES_BLOCK_SIZE);
        }
#else
# ifdef FAST_BUFFER_OPERATIONS
        if(!ALIGN_OFFSET( ibuf, 4 ) && !ALIGN_OFFSET( obuf, 4 ) &&!ALIGN_OFFSET( iv, 4 ))
            while(cnt + AES_BLOCK_SIZE <= len)
            {   uint32_t t;

                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                t = lp32(ibuf)[0], lp32(obuf)[0] = t ^ lp32(iv)[0], lp32(iv)[0] = t;
                t = lp32(ibuf)[1], lp32(obuf)[1] = t ^ lp32(iv)[1], lp32(iv)[1] = t;
                t = lp32(ibuf)[2], lp32(obuf)[2] = t ^ lp32(iv)[2], lp32(iv)[2] = t;
                t = lp32(ibuf)[3], lp32(obuf)[3] = t ^ lp32(iv)[3], lp32(iv)[3] = t;
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
        else
# endif
            while(cnt + AES_BLOCK_SIZE <= len)
            {   uint8_t t;

                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                t = ibuf[ 0], obuf[ 0] = t ^ iv[ 0], iv[ 0] = t;
                t = ibuf[ 1], obuf[ 1] = t ^ iv[ 1], iv[ 1] = t;
                t = ibuf[ 2], obuf[ 2] = t ^ iv[ 2], iv[ 2] = t;
                t = ibuf[ 3], obuf[ 3] = t ^ iv[ 3], iv[ 3] = t;
                t = ibuf[ 4], obuf[ 4] = t ^ iv[ 4], iv[ 4] = t;
                t = ibuf[ 5], obuf[ 5] = t ^ iv[ 5], iv[ 5] = t;
                t = ibuf[ 6], obuf[ 6] = t ^ iv[ 6], iv[ 6] = t;
                t = ibuf[ 7], obuf[ 7] = t ^ iv[ 7], iv[ 7] = t;
                t = ibuf[ 8], obuf[ 8] = t ^ iv[ 8], iv[ 8] = t;
                t = ibuf[ 9], obuf[ 9] = t ^ iv[ 9], iv[ 9] = t;
                t = ibuf[10], obuf[10] = t ^ iv[10], iv[10] = t;
                t = ibuf[11], obuf[11] = t ^ iv[11], iv[11] = t;
                t = ibuf[12], obuf[12] = t ^ iv[12], iv[12] = t;
                t = ibuf[13], obuf[13] = t ^ iv[13], iv[13] = t;
                t = ibuf[14], obuf[14] = t ^ iv[14], iv[14] = t;
                t = ibuf[15], obuf[15] = t ^ iv[15], iv[15] = t;
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
#endif
    }

    while(cnt < len)
    {   uint8_t t;

        if(!b_pos && aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
            return EXIT_FAILURE;

        while(cnt < len && b_pos < AES_BLOCK_SIZE)
        {
            t = *ibuf++;
            *obuf++ = t ^ iv[b_pos];
            iv[b_pos++] = t;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    ctx->inf.b[2] = (uint8_t)b_pos;
    return EXIT_SUCCESS;
}